

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O2

bool google::sparsehash_internal::read_bigendian_number<StringIO,unsigned_short>
               (StringIO *fp,unsigned_short *value,size_t length)

{
  bool bVar1;
  undefined8 in_RAX;
  int iVar2;
  ulong uVar3;
  undefined8 uStack_38;
  uchar byte;
  
  *value = 0;
  iVar2 = (int)length * 8;
  uStack_38 = in_RAX;
  for (uVar3 = 0; iVar2 = iVar2 + -8, length != uVar3; uVar3 = uVar3 + 1) {
    bVar1 = read_data<StringIO>(fp,&byte,1);
    if (!bVar1) break;
    *value = *value | (ushort)byte << ((byte)iVar2 & 0x1f);
  }
  return length <= uVar3;
}

Assistant:

bool read_bigendian_number(INPUT* fp, IntType* value, size_t length) {
  *value = 0;
  unsigned char byte;
  // We require IntType to be unsigned or else the shifting gets all screwy.
  static_assert(static_cast<IntType>(-1) > static_cast<IntType>(0),
                "serializing int requires an unsigned type");
  for (size_t i = 0; i < length; ++i) {
    if (!read_data(fp, &byte, sizeof(byte))) return false;
    *value |= static_cast<IntType>(byte) << ((length - 1 - i) * 8);
  }
  return true;
}